

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

word Extra_Truth6MinimumExact(word t,int *pComp,int *pPerm)

{
  word t_00;
  ulong t_01;
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  word wVar5;
  
  wVar5 = 0xffffffffffffffff;
  lVar1 = 0;
  do {
    if (lVar1 == 2) {
      return wVar5;
    }
    uVar4 = -lVar1;
    t_01 = uVar4 ^ t;
    for (lVar3 = 0; lVar3 != 0x2d0; lVar3 = lVar3 + 1) {
      t_00 = t_01;
      for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
        if (t_00 <= wVar5) {
          wVar5 = t_00;
        }
        t_00 = Extra_Truth6ChangePhase(t_00,pComp[lVar2]);
      }
      if (t_01 != t_00) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                      ,0x907,"word Extra_Truth6MinimumExact(word, int *, int *)");
      }
      t_01 = Extra_Truth6SwapAdjacent(t_01,pPerm[lVar3]);
    }
    lVar1 = lVar1 + 1;
    if ((uVar4 ^ t) != t_01) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                    ,0x90a,"word Extra_Truth6MinimumExact(word, int *, int *)");
    }
  } while( true );
}

Assistant:

word Extra_Truth6MinimumExact( word t, int * pComp, int * pPerm )
{
    word tMin = ~(word)0;
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~t : t;
        tTemp1 = tCur;
        for ( p = 0; p < 720; p++ )
        {
//            printf( "Trying perm %d:\n", p );
//            Kit_DsdPrintFromTruth( &tCur, 6 ), printf( "\n" );;
            tTemp2 = tCur;
            for ( c = 0; c < 64; c++ )
            {
                tMin = Abc_MinWord( tMin, tCur );
                tCur = Extra_Truth6ChangePhase( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Extra_Truth6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    return tMin;
}